

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

tuple<bool,_bool,_unsigned_int> * __thiscall
spvtools::val::ValidationState_t::EvalInt32IfConst
          (tuple<bool,_bool,_unsigned_int> *__return_storage_ptr__,ValidationState_t *this,
          uint32_t id)

{
  pointer puVar1;
  uint32_t uVar2;
  int32_t iVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  uint uVar6;
  bool bVar7;
  undefined1 uVar8;
  
  pIVar4 = FindDef(this,id);
  if (pIVar4 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x591,
                  "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                 );
  }
  uVar2 = (pIVar4->inst_).type_id;
  if ((uVar2 == 0) || (pIVar5 = FindDef(this,uVar2), pIVar5 == (Instruction *)0x0)) {
    uVar6 = 0;
    bVar7 = false;
    uVar8 = 0;
  }
  else {
    uVar6 = 0;
    bVar7 = false;
    uVar8 = 0;
    if ((pIVar5->inst_).opcode == 0x15) {
      uVar2 = GetBitWidth(this,uVar2);
      uVar6 = 0;
      bVar7 = false;
      uVar8 = 0;
      if (uVar2 == 0x20) {
        iVar3 = spvOpcodeIsConstant((uint)(pIVar4->inst_).opcode);
        uVar8 = 1;
        if (iVar3 != 0) {
          iVar3 = spvOpcodeIsSpecConstant((uint)(pIVar4->inst_).opcode);
          uVar6 = 0;
          if (iVar3 == 0) {
            bVar7 = true;
            if ((pIVar4->inst_).opcode != 0x2e) {
              puVar1 = (pIVar4->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((long)(pIVar4->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 != 0x10) {
                __assert_fail("inst->words().size() == 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                              ,0x5a3,
                              "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                             );
              }
              uVar6 = puVar1[3];
            }
            uVar8 = 1;
            goto LAB_003177f0;
          }
        }
        uVar6 = 0;
        bVar7 = false;
      }
    }
  }
LAB_003177f0:
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl = uVar6;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>._M_head_impl = bVar7
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.field_0x5 = uVar8;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, bool, uint32_t> ValidationState_t::EvalInt32IfConst(
    uint32_t id) const {
  const Instruction* const inst = FindDef(id);
  assert(inst);
  const uint32_t type = inst->type_id();

  if (type == 0 || !IsIntScalarType(type) || GetBitWidth(type) != 32) {
    return std::make_tuple(false, false, 0);
  }

  // Spec constant values cannot be evaluated so don't consider constant for
  // the purpose of this method.
  if (!spvOpcodeIsConstant(inst->opcode()) ||
      spvOpcodeIsSpecConstant(inst->opcode())) {
    return std::make_tuple(true, false, 0);
  }

  if (inst->opcode() == spv::Op::OpConstantNull) {
    return std::make_tuple(true, true, 0);
  }

  assert(inst->words().size() == 4);
  return std::make_tuple(true, true, inst->word(3));
}